

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O2

int TIFFStartTile(TIFF *tif,uint32_t tile)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint64_t uVar6;
  uint uVar7;
  
  uVar7 = tif->tif_flags;
  if ((uVar7 & 0x20) == 0) {
    iVar4 = (*tif->tif_setupdecode)(tif);
    if (iVar4 == 0) {
      return 0;
    }
    uVar7 = tif->tif_flags | 0x20;
    tif->tif_flags = uVar7;
  }
  tif->tif_curtile = tile;
  uVar5 = (tif->tif_dir).td_imagewidth;
  uVar1 = (tif->tif_dir).td_tilewidth;
  if ((uVar5 < -uVar1) && (uVar5 = uVar5 - 1, !CARRY4(uVar5,uVar1))) {
    uVar2 = (tif->tif_dir).td_imagelength;
    uVar3 = (tif->tif_dir).td_tilelength;
    tif->tif_row = (int)((ulong)tile % ((ulong)(uVar5 + uVar1) / (ulong)uVar1)) * uVar3;
    if ((uVar2 < -uVar3) && (uVar5 = (uVar2 + uVar3) - 1, uVar3 <= uVar5)) {
      tif->tif_col = (int)((ulong)tile % ((ulong)uVar5 / (ulong)uVar3)) * uVar1;
      tif->tif_flags = uVar7 & 0xffefffff;
      if ((uVar7 >> 0x11 & 1) == 0) {
        uVar6 = tif->tif_rawdataloaded;
        tif->tif_rawcp = tif->tif_rawdata;
        if ((long)uVar6 < 1) {
          uVar6 = TIFFGetStrileByteCount(tif,tile);
        }
        tif->tif_rawcc = uVar6;
      }
      else {
        tif->tif_rawcp = (uint8_t *)0x0;
        tif->tif_rawcc = 0;
      }
      iVar4 = (*tif->tif_predecode)(tif,(uint16_t)(tile / (tif->tif_dir).td_stripsperimage));
      return iVar4;
    }
  }
  TIFFErrorExtR(tif,"TIFFStartTile","Zero tiles");
  return 0;
}

Assistant:

static int TIFFStartTile(TIFF *tif, uint32_t tile)
{
    static const char module[] = "TIFFStartTile";
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t howmany32;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupdecode)(tif))
            return (0);
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_curtile = tile;
    howmany32 = TIFFhowmany_32(td->td_imagewidth, td->td_tilewidth);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return 0;
    }
    tif->tif_row = (tile % howmany32) * td->td_tilelength;
    howmany32 = TIFFhowmany_32(td->td_imagelength, td->td_tilelength);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return 0;
    }
    tif->tif_col = (tile % howmany32) * td->td_tilewidth;
    tif->tif_flags &= ~TIFF_BUF4WRITE;
    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        tif->tif_rawcp = NULL;
        tif->tif_rawcc = 0;
    }
    else
    {
        tif->tif_rawcp = tif->tif_rawdata;
        if (tif->tif_rawdataloaded > 0)
            tif->tif_rawcc = tif->tif_rawdataloaded;
        else
            tif->tif_rawcc = (tmsize_t)TIFFGetStrileByteCount(tif, tile);
    }
    return (
        (*tif->tif_predecode)(tif, (uint16_t)(tile / td->td_stripsperimage)));
}